

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

ZoneState * QDateTimePrivate::expressUtcAsLocal(ZoneState *__return_storage_ptr__,qint64 utcMSecs)

{
  bool bVar1;
  int iVar2;
  DaylightStatus DVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  optional<long_long> oVar7;
  YearMonthDay YVar8;
  QTimeZone sys;
  Data local_48;
  undefined8 uStack_40;
  bool local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->valid = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->when = utcMSecs;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->dst = UnknownDaylightTime;
  __return_storage_ptr__->valid = false;
  if ((millisInSystemRange(long_long,long_long)::bounds == '\0') &&
     (iVar2 = __cxa_guard_acquire(&millisInSystemRange(long_long,long_long)::bounds), iVar2 != 0)) {
    QLocalTime::computeSystemMillisRange();
    __cxa_guard_release(&millisInSystemRange(long_long,long_long)::bounds);
  }
  if (((DAT_006b4980 != '\0') || (millisInSystemRange(long_long,long_long)::bounds <= utcMSecs)) &&
     ((DAT_006b4981 != '\0' || (utcMSecs <= DAT_006b4978)))) {
    QLocalTime::utcToLocal((ZoneState *)&local_48.s,utcMSecs);
    __return_storage_ptr__->valid = local_38;
    __return_storage_ptr__->when = (qint64)local_48;
    __return_storage_ptr__->offset = (undefined4)uStack_40;
    __return_storage_ptr__->dst = uStack_40._4_4_;
    if (__return_storage_ptr__->valid != false) goto LAB_0034793f;
  }
  local_48.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::systemTimeZone();
  bVar1 = QTimeZone::isValid((QTimeZone *)&local_48.s);
  if (bVar1) {
    iVar2 = (*(local_48.d)->_vptr_QTimeZonePrivate[8])(local_48.d,utcMSecs);
    __return_storage_ptr__->offset = iVar2;
    __return_storage_ptr__->when = (long)iVar2 * 1000 + utcMSecs;
    if (!SCARRY8((long)iVar2 * 1000,utcMSecs)) {
      DVar3 = (*(local_48.d)->_vptr_QTimeZonePrivate[0xc])(local_48.d,utcMSecs);
      __return_storage_ptr__->dst = DVar3 & 0xff;
      __return_storage_ptr__->valid = true;
    }
    QTimeZone::~QTimeZone((QTimeZone *)&local_48.s);
  }
  else {
    QTimeZone::~QTimeZone((QTimeZone *)&local_48.s);
    if (utcMSecs < 0) {
      uVar5 = ~((ulong)~utcMSecs / 86400000);
    }
    else {
      uVar5 = (ulong)utcMSecs / 86400000;
    }
    YVar8 = QGregorianCalendar::partsFromJulian(uVar5 + 0x253d8c);
    iVar2 = systemTimeYearMatching(YVar8.year);
    oVar7 = QGregorianCalendar::julianFromParts(iVar2,YVar8.month,YVar8.day);
    if (((undefined1  [16])
         oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      lVar6 = (uVar5 + 0x253d8c) -
              oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long>._M_payload;
      lVar4 = lVar6 * 86400000;
      if ((SEXT816(lVar4) == SEXT816(lVar6) * SEXT416(86400000)) && (!SBORROW8(utcMSecs,lVar4))) {
        QLocalTime::utcToLocal((ZoneState *)&local_48.s,utcMSecs + lVar6 * -86400000);
        __return_storage_ptr__->valid = local_38;
        __return_storage_ptr__->when = (qint64)local_48;
        __return_storage_ptr__->offset = (undefined4)uStack_40;
        __return_storage_ptr__->dst = uStack_40._4_4_;
        if ((__return_storage_ptr__->valid != true) ||
           (lVar6 = __return_storage_ptr__->when,
           __return_storage_ptr__->when = __return_storage_ptr__->when + lVar4, SCARRY8(lVar6,lVar4)
           )) {
          __return_storage_ptr__->when = utcMSecs;
          __return_storage_ptr__->valid = false;
        }
      }
    }
  }
LAB_0034793f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QDateTimePrivate::ZoneState QDateTimePrivate::expressUtcAsLocal(qint64 utcMSecs)
{
    ZoneState result{utcMSecs};
    // Within the time_t supported range, localtime() can handle it:
    if (millisInSystemRange(utcMSecs)) {
        result = QLocalTime::utcToLocal(utcMSecs);
        if (result.valid)
            return result;
    }

    // Docs state any LocalTime after 2038-01-18 *will* have any DST applied.
    // When this falls outside the supported range, we need to fake it.
#if QT_CONFIG(timezone) // Use the system time-zone.
    if (const auto sys = QTimeZone::systemTimeZone(); sys.isValid()) {
        result.offset = sys.d->offsetFromUtc(utcMSecs);
        if (result.offset != QTimeZonePrivate::invalidSeconds()) {
            if (qAddOverflow(utcMSecs, result.offset * MSECS_PER_SEC, &result.when))
                return result;
            result.dst = sys.d->isDaylightTime(utcMSecs) ? DaylightTime : StandardTime;
            result.valid = true;
            return result;
        }
    }
#endif // timezone

    // Kludge
    // Do the conversion in a year with the same days of the week, so DST
    // dates might be right, and adjust by the number of days that was off:
    const qint64 jd = msecsToJulianDay(utcMSecs);
    const auto ymd = QGregorianCalendar::partsFromJulian(jd);
    qint64 diffMillis, fakeUtc;
    const auto fakeJd = QGregorianCalendar::julianFromParts(systemTimeYearMatching(ymd.year),
                                                            ymd.month, ymd.day);
    if (Q_UNLIKELY(!fakeJd
                   || qMulOverflow(jd - *fakeJd, std::integral_constant<qint64, MSECS_PER_DAY>(),
                                   &diffMillis)
                   || qSubOverflow(utcMSecs, diffMillis, &fakeUtc))) {
        return result;
    }

    result = QLocalTime::utcToLocal(fakeUtc);
    // Now correct result.when for the use of the fake date:
    if (!result.valid || qAddOverflow(result.when, diffMillis, &result.when)) {
        // If utcToLocal() failed, its return has the fake when; restore utcMSecs.
        // Fail on overflow, but preserve offset and DST-ness.
        result.when = utcMSecs;
        result.valid = false;
    }
    return result;
}